

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::AutoReg::registerTestCase
          (AutoReg *this,ITestCase *testCase,char *classOrQualifiedMethodName,char *name,
          char *description,SourceLineInfo *lineInfo)

{
  IMutableRegistryHub *pIVar1;
  allocator<char> local_183;
  allocator<char> local_182;
  allocator<char> local_181;
  SourceLineInfo *local_180;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  TestCaseInfo local_f8;
  
  local_180 = lineInfo;
  pIVar1 = getMutableRegistryHub();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,classOrQualifiedMethodName,&local_181);
  extractClassName(&local_138,&local_118);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,name,&local_182);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,description,&local_183);
  TestCaseInfo::TestCaseInfo(&local_f8,testCase,&local_138,&local_158,&local_178,local_180);
  (*pIVar1->_vptr_IMutableRegistryHub[3])(pIVar1,&local_f8);
  TestCaseInfo::~TestCaseInfo(&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void AutoReg::registerTestCase( ITestCase* testCase,
                                    const char* classOrQualifiedMethodName,
                                    const char* name,
                                    const char* description,
                                    const SourceLineInfo& lineInfo ) {

        getMutableRegistryHub().registerTest( TestCaseInfo( testCase, extractClassName( classOrQualifiedMethodName ), name, description, lineInfo ) );
    }